

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::beta_dist<float>::cdf(beta_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  result_type_conflict1 rVar2;
  
  rVar2 = 0.0;
  if ((0.0 < x) && (rVar2 = 1.0, x < 1.0)) {
    fVar1 = math::detail::Beta_I<float>(x,(this->P).alpha_,(this->P).beta_,(this->P).norm_);
    return fVar1;
  }
  return rVar2;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      if (x >= 1)
        return 1;
      return math::Beta_I(x, P.alpha(), P.beta(), P.norm());
    }